

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O0

void __thiscall
amrex::CellConservativeProtected::protect
          (CellConservativeProtected *this,FArrayBox *param_2,int param_3,FArrayBox *fine,
          int param_5,FArrayBox *fine_state,int param_7,int ncomp,Box *fine_region,IntVect *ratio,
          Geometry *crse_geom,Geometry *fine_geom,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_13,RunOn runon)

{
  BaseFab<double> *in_RCX;
  long *in_RDI;
  long in_R9;
  Box *in_stack_00000018;
  undefined8 *in_stack_00000020;
  undefined8 in_stack_00000030;
  Array4<const_double> *fnstarr;
  Array4<double> *fnarr;
  Box *fnbx;
  Box cs_bx;
  Box crse_bx;
  Box target_fine_region;
  Box *in_stack_fffffffffffffbf8;
  anon_class_176_5_12609229 *f;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffc4c;
  undefined1 auStack_3b0 [64];
  undefined1 auStack_370 [64];
  Array4<const_double> local_330;
  Array4<const_double> *local_2f0;
  Array4<double> local_2e8;
  Array4<double> *local_2a8;
  Box *local_2a0;
  Box local_298;
  int local_270 [7];
  undefined1 local_254 [28];
  long local_238;
  BaseFab<double> *local_228;
  long local_208;
  BaseFab<double> *local_200;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  Dim3 local_1e0;
  Dim3 local_1cc;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  double *local_198;
  Dim3 local_190;
  undefined8 *local_180;
  undefined4 local_178;
  undefined4 uStack_174;
  int local_170;
  undefined4 local_16c;
  undefined8 *local_168;
  undefined4 local_15c;
  undefined8 *local_158;
  undefined4 local_14c;
  undefined8 *local_148;
  Dim3 local_140;
  undefined8 *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  long local_118;
  undefined4 local_10c;
  long local_108;
  undefined4 local_fc;
  int *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  Box *local_b0;
  double *local_a8;
  Dim3 local_a0;
  Box *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  Box *local_78;
  undefined4 local_6c;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  Dim3 local_50;
  Box *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  IntVect *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_238 = in_R9;
  local_228 = in_RCX;
  BaseFab<double>::box(in_RCX);
  Box::operator&(in_stack_00000018,in_stack_fffffffffffffbf8);
  (**(code **)(*in_RDI + 0x18))(local_270,in_RDI,local_254,in_stack_00000020);
  local_298.bigend.vect[2] = local_270[5];
  local_298.btype.itype = local_270[6];
  local_298.smallend.vect[0] = local_270[0];
  local_298.smallend.vect[1] = local_270[1];
  Box::grow(&local_298,-1);
  local_1f0 = in_stack_00000030;
  local_2a0 = BaseFab<double>::box(local_228);
  local_200 = local_228;
  local_a8 = local_228->dptr;
  local_b0 = &local_228->domain;
  local_b4 = local_228->nvar;
  local_5c = 0;
  local_88 = (local_b0->smallend).vect[0];
  local_6c = 1;
  iStack_84 = (local_228->domain).smallend.vect[1];
  local_d0.x = (local_b0->smallend).vect[0];
  local_d0.y = (local_b0->smallend).vect[1];
  local_7c = 2;
  local_d0.z = (local_228->domain).smallend.vect[2];
  local_8 = &(local_228->domain).bigend;
  local_c = 0;
  local_38 = local_8->vect[0] + 1;
  local_18 = &(local_228->domain).bigend;
  local_1c = 1;
  iStack_34 = (local_228->domain).bigend.vect[1] + 1;
  local_28 = &(local_228->domain).bigend;
  local_2c = 2;
  local_f0.z = (local_228->domain).bigend.vect[2] + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_e0._0_8_ = local_f0._0_8_;
  local_e0.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<double>::Array4(&local_2e8,local_a8,&local_c0,&local_e0,local_b4);
  local_208 = local_238;
  local_198 = *(double **)(local_238 + 0x10);
  local_1a0 = (undefined8 *)(local_238 + 0x18);
  local_1a4 = *(int *)(local_238 + 0x34);
  local_14c = 0;
  local_178 = *(undefined4 *)local_1a0;
  local_15c = 1;
  uStack_174 = *(undefined4 *)(local_238 + 0x1c);
  local_1c0._0_8_ = *local_1a0;
  local_16c = 2;
  local_1c0.z = *(int *)(local_238 + 0x20);
  local_f8 = (int *)(local_238 + 0x24);
  local_fc = 0;
  local_128 = *local_f8 + 1;
  local_108 = local_238 + 0x24;
  local_10c = 1;
  iStack_124 = *(int *)(local_238 + 0x28) + 1;
  local_118 = local_238 + 0x24;
  local_11c = 2;
  local_1e0.z = *(int *)(local_238 + 0x2c) + 1;
  local_1e0.y = iStack_124;
  local_1e0.x = local_128;
  local_2a8 = &local_2e8;
  local_1cc._0_8_ = local_1e0._0_8_;
  local_1cc.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_190._0_8_ = local_1c0._0_8_;
  local_190.z = local_1c0.z;
  local_180 = local_1a0;
  local_170 = local_1c0.z;
  local_168 = local_1a0;
  local_158 = local_1a0;
  local_148 = local_1a0;
  local_140._0_8_ = local_1e0._0_8_;
  local_140.z = local_1e0.z;
  local_130 = local_1a0;
  local_120 = local_1e0.z;
  Array4<const_double>::Array4(&local_330,local_198,&local_1b0,&local_1cc,local_1a4);
  local_2f0 = &local_330;
  local_1f8 = &stack0x00000040;
  f = (anon_class_176_5_12609229 *)*in_stack_00000020;
  uVar1 = *(undefined4 *)(in_stack_00000020 + 1);
  memcpy(auStack_3b0,local_2a8,0x3c);
  memcpy(auStack_370,local_2f0,0x3c);
  LoopConcurrentOnCpu<amrex::CellConservativeProtected::protect(amrex::FArrayBox_const&,int,amrex::FArrayBox&,int,amrex::FArrayBox&,int,int,amrex::Box_const&,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>&,amrex::RunOn)::__0>
            ((Box *)CONCAT44(in_stack_fffffffffffffc4c,uVar1),f);
  return;
}

Assistant:

void
CellConservativeProtected::protect (const FArrayBox& /*crse*/,
                                    int              /*crse_comp*/,
                                    FArrayBox&       fine,
                                    int              /*fine_comp*/,
                                    FArrayBox&       fine_state,
                                    int              /*state_comp*/,
                                    int              ncomp,
                                    const Box&       fine_region,
                                    const IntVect&   ratio,
                                    const Geometry&  crse_geom,
                                    const Geometry&  fine_geom,
                                    Vector<BCRec>&   /*bcr*/,
                                    RunOn            runon)
{
#if (AMREX_SPACEDIM == 1)
    amrex::ignore_unused(fine,fine_state,
                         ncomp,fine_region,ratio,
                         crse_geom,fine_geom,runon);
    amrex::Abort("1D CellConservativeProtected::protect not supported");
#else
    BL_PROFILE("CellConservativeProtected::protect()");

    //
    // Make box which is intersection of fine_region and domain of fine.
    //
    Box target_fine_region = fine_region & fine.box();

    //
    // crse_bx is coarsening of target_fine_region, grown by 1.
    //
    Box crse_bx = CoarseBox(target_fine_region,ratio);

    //
    // cs_bx is coarsening of target_fine_region.
    //
    Box cs_bx(crse_bx);
    cs_bx.grow(-1);

#if (AMREX_SPACEDIM == 2)
    /*
     * Get coarse and fine geometry data.
     */
    GeometryData cs_geomdata = crse_geom.data();
    GeometryData fn_geomdata = fine_geom.data();
#else
    amrex::ignore_unused(crse_geom, fine_geom);
#endif

    // Extract box from fine fab
    const Box& fnbx = fine.box();

    // Extract pointers to fab data
    Array4<Real>       const&   fnarr = fine.array();
    Array4<Real const> const& fnstarr = fine_state.const_array();

    /*
     * Loop over coarse indices.
     */
#if (AMREX_SPACEDIM == 2)
    AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cs_bx, ic, jc, kc,
    {
        ccprotect_2d(ic, jc, kc, ncomp,
                     fnbx, ratio,
                     cs_geomdata, fn_geomdata,
                     fnarr, fnstarr);
    }); // cs_bx
#else
    AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cs_bx, ic, jc, kc,
    {
        ccprotect_3d(ic, jc, kc, ncomp,
                     fnbx, ratio,
                     fnarr, fnstarr);
    }); // cs_bx
#endif

#endif /*(AMREX_SPACEDIM == 1)*/

}